

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O1

void dpfb::args::pickDefaultPlugin<dpfb::FontRendererCreator>(char **arg,char *errorMsg)

{
  bool bVar1;
  int iVar2;
  FontRendererCreator *this;
  char *pcVar3;
  ImageWriter *this_00;
  FontWriter *pFVar4;
  size_t sVar5;
  undefined4 extraout_var;
  char **array;
  int *array_00;
  ulong uVar6;
  args *this_01;
  args *optArgsEnd;
  char **optArgsEnd_00;
  
  if (**arg == '\0') {
    this_01 = (args *)errorMsg;
    this = FontRendererCreator::getFirst();
    if (this == (FontRendererCreator *)0x0) {
      pickDefaultPlugin<dpfb::FontRendererCreator>((args *)errorMsg);
      if (**(char **)errorMsg == '\0') {
        optArgsEnd = this_01;
        this_00 = ImageWriter::getFirst();
        if (this_00 == (ImageWriter *)0x0) {
          pickDefaultPlugin<dpfb::ImageWriter>(this_01);
          advanceToArg((char ***)this_01,(char **)optArgsEnd);
          optArgsEnd_00 = array;
          bVar1 = parseIntArray((char *)**(undefined8 **)this_01,(int *)array,4);
          if (bVar1) {
            return;
          }
          getValue<4ul>(this_01);
          advanceToArg((char ***)this_01,optArgsEnd_00);
          bVar1 = parseIntArray((char *)**(undefined8 **)this_01,array_00,2);
          if (bVar1) {
            return;
          }
          getValue<2ul>(this_01);
          pFVar4 = FontWriter::getFirst();
          if (pFVar4 == (FontWriter *)0x0) {
            uVar6 = 0;
          }
          else {
            uVar6 = 0;
            do {
              pcVar3 = FontWriter::getName(pFVar4);
              sVar5 = strlen(pcVar3);
              if (uVar6 < sVar5) {
                uVar6 = sVar5;
              }
              pFVar4 = FontWriter::getNext(pFVar4);
            } while (pFVar4 != (FontWriter *)0x0);
          }
          for (pFVar4 = FontWriter::getFirst(); pFVar4 != (FontWriter *)0x0;
              pFVar4 = FontWriter::getNext(pFVar4)) {
            pcVar3 = FontWriter::getName(pFVar4);
            iVar2 = (*pFVar4->_vptr_FontWriter[2])(pFVar4);
            printf("  %-*s  %s\n",uVar6 & 0xffffffff,pcVar3,CONCAT44(extraout_var,iVar2));
          }
          putchar(10);
          return;
        }
        pcVar3 = ImageWriter::getName(this_00);
        *(char **)errorMsg = pcVar3;
      }
      return;
    }
    pcVar3 = FontRendererCreator::getName(this);
    *arg = pcVar3;
  }
  return;
}

Assistant:

void pickDefaultPlugin(const char*& arg, const char* errorMsg)
{
    if (arg[0])
        return;

    const auto* p = T::getFirst();
    if (!p) {
        std::fputs(errorMsg, stderr);
        std::exit(EXIT_FAILURE);
    }
    arg = p->getName();
}